

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O2

QString * appendSlashIfNeeded(QString *__return_storage_ptr__,QString *path)

{
  bool bVar1;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_char16_t> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (((path->d).size == 0) || (bVar1 = QString::endsWith(path,(QChar)0x2f,CaseSensitive), bVar1)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&path->d);
      return __return_storage_ptr__;
    }
  }
  else {
    local_28.b = L'/';
    local_28.a = path;
    QStringBuilder<const_QString_&,_char16_t>::convertTo<QString>(__return_storage_ptr__,&local_28);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

static QString appendSlashIfNeeded(const QString &path)
{
    if (!path.isEmpty() && !path.endsWith(u'/')
#ifdef Q_OS_ANDROID
        && !path.startsWith("content:/"_L1)
#endif
        )
        return QString{path + u'/'};
    return path;
}